

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topn_optimizer.cpp
# Opt level: O1

void __thiscall duckdb::TopN::PushdownDynamicFilters(TopN *this,LogicalTopN *op)

{
  vector<duckdb::BoundOrderByNode,_true> *this_00;
  _Head_base<0UL,_duckdb::ConstantFilter_*,_false> _Var1;
  LogicalGet *this_01;
  size_type __n;
  ExpressionType comparison_type_p;
  char cVar2;
  pointer pPVar3;
  bool bVar4;
  reference pvVar5;
  pointer pEVar6;
  pointer pEVar7;
  BoundColumnRefExpression *pBVar8;
  reference this_02;
  type op_00;
  _Head_base<0UL,_duckdb::ConstantFilter_*,_false> this_03;
  DynamicFilterData *pDVar9;
  reference pvVar10;
  tuple<duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_> this_04;
  OptionalFilter *this_05;
  vector<duckdb::ColumnIndex,_true> *this_06;
  const_reference col_idx;
  pointer pPVar11;
  shared_ptr<duckdb::DynamicFilterData,_true> filter_data;
  vector<duckdb::JoinFilterPushdownColumn,_true> columns;
  vector<duckdb::PushdownFilterTarget,_true> pushdown_targets;
  Value minimum_value;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_140;
  shared_ptr<duckdb::DynamicFilterData,_true> local_138;
  pointer local_128;
  pointer pJStack_120;
  pointer local_118;
  vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_> local_108;
  Value local_e8;
  vector<duckdb::JoinFilterPushdownColumn,_true> local_a8;
  JoinFilterPushdownColumn local_88;
  Value local_70;
  
  this_00 = &op->orders;
  pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
  if (pvVar5->null_order != NULLS_FIRST) {
    pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pvVar5->expression);
    bVar4 = TypeIsIntegral((pEVar6->return_type).physical_type_);
    if ((bVar4) || ((pEVar6->return_type).id_ == VARCHAR)) {
      pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pvVar5->expression);
      if ((pEVar7->super_BaseExpression).type == BOUND_COLUMN_REF) {
        pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pvVar5->expression);
        pBVar8 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                           (&pEVar7->super_BaseExpression);
        local_128 = (pointer)0x0;
        pJStack_120 = (pointer)0x0;
        local_118 = (pointer)0x0;
        local_88.probe_column_index.table_index = (pBVar8->binding).table_index;
        local_88.probe_column_index.column_index = (pBVar8->binding).column_index;
        ::std::
        vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>::
        _M_realloc_insert<duckdb::JoinFilterPushdownColumn&>
                  ((vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>
                    *)&local_128,(iterator)0x0,&local_88);
        local_108.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_02 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::operator[](&(op->super_LogicalOperator).children,0);
        op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*(this_02);
        local_a8.
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start = local_128;
        local_a8.
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish = pJStack_120;
        local_a8.
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        .
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_118;
        local_128 = (pointer)0x0;
        pJStack_120 = (pointer)0x0;
        local_118 = (pointer)0x0;
        JoinFilterPushdownOptimizer::GetPushdownFilterTargets
                  (op_00,&local_a8,(vector<duckdb::PushdownFilterTarget,_true> *)&local_108);
        if (local_a8.
            super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            .
            super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.
                          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                          .
                          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_108.
            super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_108.
            super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[](this_00,0);
          cVar2 = ((long)(op->orders).
                         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         .
                         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(op->orders).
                         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         .
                         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_start != 0x18) * '\x02';
          comparison_type_p = cVar2 + COMPARE_GREATERTHAN;
          if (pvVar5->type == ASCENDING) {
            comparison_type_p = cVar2 + COMPARE_LESSTHAN;
          }
          if ((pEVar6->return_type).physical_type_ == VARCHAR) {
            Value::Value(&local_70,anon_var_dwarf_4f001a4 + 9);
          }
          else {
            Value::MinimumValue(&local_70,&pEVar6->return_type);
          }
          this_03._M_head_impl = (ConstantFilter *)operator_new(0x50);
          Value::Value(&local_e8,&local_70);
          ConstantFilter::ConstantFilter(this_03._M_head_impl,comparison_type_p,&local_e8);
          Value::~Value(&local_e8);
          local_138.internal.
          super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
          *(undefined8 *)
           &((element_type *)
            local_138.internal.
            super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->type = 0x100000001;
          ((element_type *)
          local_138.internal.
          super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr_ExtraTypeInfo = (_func_int **)&PTR___Sp_counted_ptr_inplace_02477ce0;
          local_138.internal.
          super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               &((element_type *)
                local_138.internal.
                super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->alias;
          (((element_type *)
           local_138.internal.
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->alias)._M_dataplus._M_p = (pointer)0x0;
          (((element_type *)
           local_138.internal.
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->alias)._M_string_length = 0;
          (((element_type *)
           local_138.internal.
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->alias).field_2._M_allocated_capacity = 0;
          *(undefined8 *)
           ((long)&(((element_type *)
                    local_138.internal.
                    super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->alias).field_2 + 8) = 0;
          (((element_type *)
           local_138.internal.
           super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->extension_info).
          super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl =
               (ExtensionTypeInfo *)0x0;
          ((element_type *)
          ((long)local_138.internal.
                 super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi + 0x38))->_vptr_ExtraTypeInfo = (_func_int **)0x0;
          *(undefined8 *)
           &((element_type *)
            ((long)local_138.internal.
                   super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 0x38))->type = 0;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((element_type *)
                     local_138.internal.
                     super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->type =
                 *(int *)&((element_type *)
                          local_138.internal.
                          super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->type + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             &((element_type *)
              local_138.internal.
              super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->type = 2;
          }
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_138.internal.
                     super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          pDVar9 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(&local_138);
          _Var1._M_head_impl =
               (pDVar9->filter).
               super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
               .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl;
          (pDVar9->filter).
          super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
          .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl =
               this_03._M_head_impl;
          if (_Var1._M_head_impl != (ConstantFilter *)0x0) {
            (**(code **)(*(long *)&(_Var1._M_head_impl)->super_TableFilter + 8))();
          }
          shared_ptr<duckdb::DynamicFilterData,_true>::operator=(&op->dynamic_filter,&local_138);
          pPVar3 = local_108.
                   super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar11 = local_108.
                         super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar11 != pPVar3;
              pPVar11 = pPVar11 + 1) {
            this_01 = pPVar11->get;
            pvVar10 = vector<duckdb::JoinFilterPushdownColumn,_true>::operator[]
                                (&pPVar11->columns,0);
            __n = (pvVar10->probe_column_index).column_index;
            this_04.
            super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
            .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 )operator_new(0x20);
            local_e8.type_._0_8_ =
                 local_138.internal.
                 super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_138.internal.
                 super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((element_type *)
                local_138.internal.
                super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_138.internal.
                 super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_138.internal.
                      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_138.internal.
                 super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_138.internal.
                      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            DynamicFilter::DynamicFilter
                      ((DynamicFilter *)
                       this_04.
                       super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                       .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl,
                       (shared_ptr<duckdb::DynamicFilterData,_true> *)&local_e8);
            if (local_e8.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_e8.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            this_05 = (OptionalFilter *)operator_new(0x18);
            local_e8.type_._0_8_ =
                 this_04.
                 super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>
                 .super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
            OptionalFilter::OptionalFilter
                      (this_05,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                                *)&local_e8);
            if ((_Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>)
                local_e8.type_._0_8_ != (TableFilter *)0x0) {
              (**(code **)(*(long *)local_e8.type_._0_8_ + 8))();
            }
            this_06 = LogicalGet::GetColumnIds(this_01);
            col_idx = vector<duckdb::ColumnIndex,_true>::operator[](this_06,__n);
            local_140._M_head_impl = (TableFilter *)this_05;
            TableFilterSet::PushFilter
                      (&this_01->table_filters,col_idx,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_140);
            if ((OptionalFilter *)local_140._M_head_impl != (OptionalFilter *)0x0) {
              (*((TableFilter *)&(local_140._M_head_impl)->_vptr_TableFilter)->_vptr_TableFilter[1])
                        ();
            }
            local_140._M_head_impl = (TableFilter *)0x0;
          }
          if ((element_type *)
              local_138.internal.
              super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_138.internal.
                       super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          Value::~Value(&local_70);
        }
        ::std::vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>::
        ~vector(&local_108);
        if (local_128 != (pointer)0x0) {
          operator_delete(local_128);
        }
      }
    }
  }
  return;
}

Assistant:

void TopN::PushdownDynamicFilters(LogicalTopN &op) {
	// pushdown dynamic filters through the Top-N operator
	if (op.orders[0].null_order == OrderByNullType::NULLS_FIRST) {
		// FIXME: not supported for NULLS FIRST quite yet
		// we can support NULLS FIRST by doing (x IS NULL) OR [boundary value]
		return;
	}
	auto &type = op.orders[0].expression->return_type;
	if (!TypeIsIntegral(type.InternalType()) && type.id() != LogicalTypeId::VARCHAR) {
		// only supported for integral types currently
		return;
	}
	if (op.orders[0].expression->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
		// we can only pushdown on ORDER BY [col] currently
		return;
	}
	auto &colref = op.orders[0].expression->Cast<BoundColumnRefExpression>();
	vector<JoinFilterPushdownColumn> columns;
	JoinFilterPushdownColumn column;
	column.probe_column_index = colref.binding;
	columns.emplace_back(column);
	vector<PushdownFilterTarget> pushdown_targets;
	JoinFilterPushdownOptimizer::GetPushdownFilterTargets(*op.children[0], std::move(columns), pushdown_targets);
	if (pushdown_targets.empty()) {
		// no pushdown targets
		return;
	}
	// found pushdown targets! generate dynamic filters
	ExpressionType comparison_type;
	if (op.orders[0].type == OrderType::ASCENDING) {
		// for ascending order, we want the lowest N elements, so we filter on C <= [boundary]
		// if we only have a single order clause, we can filter on C < boundary
		comparison_type =
		    op.orders.size() == 1 ? ExpressionType::COMPARE_LESSTHAN : ExpressionType::COMPARE_LESSTHANOREQUALTO;
	} else {
		// for descending order, we want the highest N elements, so we filter on C >= [boundary]
		// if we only have a single order clause, we can filter on C > boundary
		comparison_type =
		    op.orders.size() == 1 ? ExpressionType::COMPARE_GREATERTHAN : ExpressionType::COMPARE_GREATERTHANOREQUALTO;
	}
	Value minimum_value = type.InternalType() == PhysicalType::VARCHAR ? Value("") : Value::MinimumValue(type);
	auto base_filter = make_uniq<ConstantFilter>(comparison_type, std::move(minimum_value));
	auto filter_data = make_shared_ptr<DynamicFilterData>();
	filter_data->filter = std::move(base_filter);

	// put the filter into the Top-N clause
	op.dynamic_filter = filter_data;

	for (auto &target : pushdown_targets) {
		auto &get = target.get;
		D_ASSERT(target.columns.size() == 1);
		auto col_idx = target.columns[0].probe_column_index.column_index;

		// create the actual dynamic filter
		auto dynamic_filter = make_uniq<DynamicFilter>(filter_data);
		auto optional_filter = make_uniq<OptionalFilter>(std::move(dynamic_filter));

		// push the filter into the table scan
		auto &column_index = get.GetColumnIds()[col_idx];
		get.table_filters.PushFilter(column_index, std::move(optional_filter));
	}
}